

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O2

bool __thiscall cmCTestResourceSpec::Resource::operator==(Resource *this,Resource *other)

{
  __type _Var1;
  
  _Var1 = std::operator==(&this->Id,&other->Id);
  return _Var1 && this->Capacity == other->Capacity;
}

Assistant:

bool cmCTestResourceSpec::Resource::operator==(
  const cmCTestResourceSpec::Resource& other) const
{
  return this->Id == other.Id && this->Capacity == other.Capacity;
}